

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_move.cc
# Opt level: O0

string * __thiscall hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(HanabiMove *this)

{
  int8_t iVar1;
  char cVar2;
  int8_t iVar3;
  char cVar4;
  Type TVar5;
  HanabiMove *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9c;
  undefined1 in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  string *this_00;
  allocator local_203;
  allocator local_202;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  string local_30 [48];
  
  this_00 = in_RDI;
  TVar5 = MoveType(in_RSI);
  switch(TVar5) {
  case kPlay:
    CardIndex(in_RSI);
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd9f,
                                    CONCAT16(in_stack_fffffffffffffd9e,
                                             CONCAT15(in_stack_fffffffffffffd9d,
                                                      CONCAT14(in_stack_fffffffffffffd9c,
                                                               in_stack_fffffffffffffd98)))),
                   in_stack_fffffffffffffd90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    break;
  case kDiscard:
    CardIndex(in_RSI);
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd9f,
                                    CONCAT16(in_stack_fffffffffffffd9e,
                                             CONCAT15(in_stack_fffffffffffffd9d,
                                                      CONCAT14(in_stack_fffffffffffffd9c,
                                                               in_stack_fffffffffffffd98)))),
                   in_stack_fffffffffffffd90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    break;
  case kRevealColor:
    TargetOffset(in_RSI);
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd9f,
                                    CONCAT16(in_stack_fffffffffffffd9e,
                                             CONCAT15(in_stack_fffffffffffffd9d,
                                                      CONCAT14(in_stack_fffffffffffffd9c,
                                                               in_stack_fffffffffffffd98)))),
                   in_stack_fffffffffffffd90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    iVar1 = Color(in_RSI);
    ColorIndexToChar((int)iVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    break;
  case kRevealRank:
    TargetOffset(in_RSI);
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd9f,
                                    CONCAT16(in_stack_fffffffffffffd9e,
                                             CONCAT15(in_stack_fffffffffffffd9d,
                                                      CONCAT14(in_stack_fffffffffffffd9c,
                                                               in_stack_fffffffffffffd98)))),
                   in_stack_fffffffffffffd90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    iVar1 = Rank(in_RSI);
    RankIndexToChar((int)iVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98)))),
                   (char *)in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    break;
  case kDeal:
    if (in_RSI->color_ < '\0') {
      paVar6 = &local_202;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_00,"(Deal XX)",paVar6);
      std::allocator<char>::~allocator((allocator<char> *)&local_202);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"(Deal ",&local_201);
      iVar1 = Color(in_RSI);
      cVar2 = ColorIndexToChar((int)iVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(iVar1,CONCAT16(cVar2,CONCAT15(in_stack_fffffffffffffd9d,
                                                            CONCAT14(in_stack_fffffffffffffd9c,
                                                                     in_stack_fffffffffffffd98)))),
                     (char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
      iVar3 = Rank(in_RSI);
      cVar4 = RankIndexToChar((int)iVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(iVar1,CONCAT16(cVar2,CONCAT15(iVar3,CONCAT14(cVar4,
                                                  in_stack_fffffffffffffd98)))),
                     (char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(iVar1,CONCAT16(cVar2,CONCAT15(iVar3,CONCAT14(cVar4,
                                                  in_stack_fffffffffffffd98)))),
                     (char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
    }
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"(INVALID)",&local_203);
    std::allocator<char>::~allocator((allocator<char> *)&local_203);
  }
  return in_RDI;
}

Assistant:

std::string HanabiMove::ToString() const {
  switch (MoveType()) {
    case kPlay:
      return "(Play " + std::to_string(CardIndex()) + ")";
    case kDiscard:
      return "(Discard " + std::to_string(CardIndex()) + ")";
    case kRevealColor:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " color " +
             ColorIndexToChar(Color()) + ")";
    case kRevealRank:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " rank " +
             RankIndexToChar(Rank()) + ")";
    case kDeal:
      if (color_ >= 0) {
        return std::string("(Deal ") + ColorIndexToChar(Color()) +
               RankIndexToChar(Rank()) + ")";
      } else {
        return std::string("(Deal XX)");
      }
    default:
      return "(INVALID)";
  }
}